

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_fclose(Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  Value local_a8;
  Value local_98;
  FILE *local_88;
  FILE *handle;
  FileHandleStorage *storage;
  Value local_70;
  undefined1 local_60 [8];
  Value fileWrapper;
  String local_40;
  Value self;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  MiniScript::String::String(&local_40,"self");
  MiniScript::Context::GetVar
            ((Context *)&stack0xffffffffffffffd0,(String *)partialResult,(LocalOnlyMode)&local_40);
  MiniScript::String::~String(&local_40);
  MiniScript::Value::Value(&local_70,&_handle);
  MiniScript::Value::Lookup((Value *)local_60,(Value *)&stack0xffffffffffffffd0);
  MiniScript::Value::~Value(&local_70);
  bVar1 = MiniScript::Value::IsNull((Value *)local_60);
  if ((bVar1) || (local_60[0] != Handle)) {
    MiniScript::IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  }
  else {
    handle = (FILE *)fileWrapper._0_8_;
    local_88 = *(FILE **)(fileWrapper._0_8_ + 0x10);
    if (local_88 == (FILE *)0x0) {
      MiniScript::Value::Value(&local_98,(Value *)MiniScript::Value::zero);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_98,true);
      MiniScript::Value::~Value(&local_98);
    }
    else {
      fclose(local_88);
      handle->_IO_read_end = (char *)0x0;
      MiniScript::Value::Value(&local_a8,(Value *)MiniScript::Value::one);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_a8,true);
      MiniScript::Value::~Value(&local_a8);
    }
  }
  storage._4_4_ = 1;
  MiniScript::Value::~Value((Value *)local_60);
  MiniScript::Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_fclose(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult(Value::zero);
	fclose(handle);
	storage->f = nullptr;
	return IntrinsicResult(Value::one);
}